

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 07.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long *plVar1;
  int iVar2;
  
  setlocale(6,"");
  iVar2 = 5;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_8d8,0xb)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Shopenhauer!",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_904,0xc)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Goethe!",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Schiler!",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Richard Wagner!",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Georges Bizet!",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Peter gast",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_97c,0x21);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_992,0x21);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Kant",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Parmenides",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hegel",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Richard Wagner!",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  plVar1 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_9d2,0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Com Richard Wagner, quando percebeu o nome ",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Dele ligado ao antisemitismo e outros ",0x26);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_a14,0x17);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    setlocale(LC_ALL, "");

    for (int i = 0; i < 5; i++)
    {

        cout << "Heráclito!" << endl;
        cout << "Shopenhauer!" << endl;
        cout << "Lou Salomé!" << endl;
        cout << "Goethe!" << endl;
        cout << "Schiler!" << endl;
        cout << "Richard Wagner!" << endl;
        cout << "Georges Bizet!" << endl;
        cout << "Peter gast" << endl;
        cout << "São Inspirações Nietzscheanas!" << endl;
    }

    cout << endl
         << endl;
    cout << "Anti inspirações Nietzscheanas!" << endl;
    cout << "Kant" << endl;
    cout << "Parmenides" << endl;
    cout << "Hegel" << endl;
    cout << "Richard Wagner!" << endl;
    cout << endl
         << endl;
    cout << "P.S: Nietzsche sofreu uma séria decepção ";
    cout << "Com Richard Wagner, quando percebeu o nome ";
    cout << "Dele ligado ao antisemitismo e outros ";
    cout << "preconceitos da época.";

    return 0;
}